

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

shared_ptr<ScriptAstNode> parseScript(ostream *out,string *data)

{
  bool bVar1;
  element_type *this;
  shared_ptr<ScriptAstNode> *psVar2;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ScriptAstNode> sVar3;
  undefined1 local_a0 [8];
  shared_ptr<SemanticAnalyzer> analyzer;
  undefined1 local_88 [8];
  optional<std::shared_ptr<ScriptAstNode>_> maybeScript;
  shared_ptr<Parser> parser;
  shared_ptr<TokenBuffer> tokenBuffer;
  undefined1 local_40 [8];
  shared_ptr<Tokenizer> tokenizer;
  shared_ptr<StringReader> reader;
  string *data_local;
  ostream *out_local;
  shared_ptr<ScriptAstNode> *script;
  
  std::make_shared<StringReader,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Tokenizer,std::shared_ptr<StringReader>&>((shared_ptr<StringReader> *)local_40);
  std::make_shared<TokenBuffer,std::shared_ptr<Tokenizer>&>
            ((shared_ptr<Tokenizer> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<Parser,std::shared_ptr<TokenBuffer>&,std::ostream&>
            ((shared_ptr<TokenBuffer> *)
             &maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
              _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>
              .super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged,
             (basic_ostream<char,_std::char_traits<char>_> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this = std::__shared_ptr_access<Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>.
                     super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged);
  Parser::parseScript((optional<std::shared_ptr<ScriptAstNode>_> *)local_88,this);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_88);
  if (!bVar1) {
    exit(1);
  }
  analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = 0;
  psVar2 = std::optional<std::shared_ptr<ScriptAstNode>_>::value
                     ((optional<std::shared_ptr<ScriptAstNode>_> *)local_88);
  std::shared_ptr<ScriptAstNode>::shared_ptr((shared_ptr<ScriptAstNode> *)out,psVar2);
  std::make_shared<SemanticAnalyzer,std::ostream&,std::shared_ptr<StringReader>&>
            ((basic_ostream<char,_std::char_traits<char>_> *)local_a0,
             (shared_ptr<StringReader> *)data);
  this_00 = std::__shared_ptr_access<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_a0);
  bVar1 = SemanticAnalyzer::isValid(this_00,(shared_ptr<ScriptAstNode> *)out);
  if (!bVar1) {
    exit(1);
  }
  analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = 1;
  std::shared_ptr<SemanticAnalyzer>::~shared_ptr((shared_ptr<SemanticAnalyzer> *)local_a0);
  if ((analyzer.super___shared_ptr<SemanticAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) == 0) {
    std::shared_ptr<ScriptAstNode>::~shared_ptr((shared_ptr<ScriptAstNode> *)out);
  }
  std::optional<std::shared_ptr<ScriptAstNode>_>::~optional
            ((optional<std::shared_ptr<ScriptAstNode>_> *)local_88);
  std::shared_ptr<Parser>::~shared_ptr
            ((shared_ptr<Parser> *)
             &maybeScript.super__Optional_base<std::shared_ptr<ScriptAstNode>,_false,_false>.
              _M_payload.super__Optional_payload<std::shared_ptr<ScriptAstNode>,_true,_false,_false>
              .super__Optional_payload_base<std::shared_ptr<ScriptAstNode>_>._M_engaged);
  std::shared_ptr<TokenBuffer>::~shared_ptr
            ((shared_ptr<TokenBuffer> *)
             &parser.super___shared_ptr<Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Tokenizer>::~shared_ptr((shared_ptr<Tokenizer> *)local_40);
  std::shared_ptr<StringReader>::~shared_ptr
            ((shared_ptr<StringReader> *)
             &tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar3.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)out;
  return (shared_ptr<ScriptAstNode>)
         sVar3.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ScriptAstNode> parseScript(std::ostream & out, const std::string & data) {
  auto reader = std::make_shared<StringReader>(data);
  auto tokenizer = std::make_shared<Tokenizer>(reader);
  auto tokenBuffer = std::make_shared<TokenBuffer>(tokenizer);
  auto parser = std::make_shared<Parser>(tokenBuffer, out);

  auto maybeScript = parser->parseScript();

  if (!maybeScript) {
    exit(1);
  }

  auto script = maybeScript.value();

  auto analyzer = std::make_shared<SemanticAnalyzer>(out, reader);

  if (!analyzer->isValid(script)) {
    exit(1);
  }

  return script;
}